

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcPropertyReferenceValue::~IfcPropertyReferenceValue
          (IfcPropertyReferenceValue *this)

{
  undefined8 *puVar1;
  long lVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  
  lVar2 = *(long *)(*(long *)this + -0x18);
  puVar1 = (undefined8 *)(&this->field_0x0 + lVar2);
  *(undefined ***)(&this->field_0x0 + lVar2) = &PTR__IfcPropertyReferenceValue_0089cbc8;
  *(undefined ***)(&this->field_0xb0 + lVar2) = &PTR__IfcPropertyReferenceValue_0089cc40;
  *(undefined ***)(&this->field_0x58 + lVar2) = &PTR__IfcPropertyReferenceValue_0089cbf0;
  *(undefined ***)
   ((long)&(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPropertyReferenceValue,_2UL>).
           _vptr_ObjectHelper + lVar2) = &PTR__IfcPropertyReferenceValue_0089cc18;
  this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
             ((long)&(this->PropertyReference).
                     super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi + lVar2);
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if ((undefined8 *)puVar1[0xf] != puVar1 + 0x11) {
    operator_delete((undefined8 *)puVar1[0xf]);
  }
  *puVar1 = 0x89cd58;
  puVar1[0x16] = 0x89cd80;
  if ((undefined8 *)puVar1[6] != puVar1 + 8) {
    operator_delete((undefined8 *)puVar1[6]);
  }
  if ((undefined8 *)puVar1[2] != puVar1 + 4) {
    operator_delete((undefined8 *)puVar1[2]);
  }
  operator_delete(puVar1);
  return;
}

Assistant:

IfcPropertyReferenceValue() : Object("IfcPropertyReferenceValue") {}